

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreplyfileimpl.cpp
# Opt level: O1

qint64 __thiscall
QNetworkReplyFileImpl::readData(QNetworkReplyFileImpl *this,char *data,qint64 maxlen)

{
  char cVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long in_FS_OFFSET;
  QLatin1String QVar6;
  QVariant local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  lVar4 = *(long *)(this + 8);
  lVar5 = -1;
  if ((((*(char *)(lVar4 + 0x22c) == '\x01') && (*(long *)(lVar4 + 0x238) != 0)) &&
      (*(int *)(*(long *)(lVar4 + 0x238) + 4) != 0)) && (*(long *)(lVar4 + 0x240) != 0)) {
    cVar1 = QIODevice::isOpen();
    if (cVar1 != '\0') {
      lVar2 = QIODevice::read(*(char **)(lVar4 + 0x240),(longlong)data);
      lVar3 = (**(code **)(*(long *)this + 0xa0))(this);
      if (lVar3 == 0) {
        (**(code **)(**(long **)(lVar4 + 0x240) + 0x70))();
      }
      if (lVar2 == 0) {
        lVar4 = (**(code **)(*(long *)this + 0xa0))(this);
        if (lVar4 == 0) goto LAB_00198f5b;
      }
      QVariant::QVariant(&local_50,200);
      QNetworkReply::setAttribute((QNetworkReply *)this,HttpStatusCodeAttribute,&local_50);
      QVariant::~QVariant(&local_50);
      QVar6.m_data = "OK";
      QVar6.m_size = 2;
      QVariant::QVariant(&local_50,QVar6);
      QNetworkReply::setAttribute((QNetworkReply *)this,HttpReasonPhraseAttribute,&local_50);
      QVariant::~QVariant(&local_50);
      lVar5 = lVar2;
    }
  }
LAB_00198f5b:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return lVar5;
  }
  __stack_chk_fail();
}

Assistant:

qint64 QNetworkReplyFileImpl::readData(char *data, qint64 maxlen)
{
    Q_D(QNetworkReplyFileImpl);
    if (!d->isFinished || !d->realFile || !d->realFile->isOpen())
        return -1;
    qint64 ret = d->realFile->read(data, maxlen);
    if (bytesAvailable() == 0)
        d->realFile->close();
    if (ret == 0 && bytesAvailable() == 0)
        return -1;
    else {
        setAttribute(QNetworkRequest::HttpStatusCodeAttribute, 200);
        setAttribute(QNetworkRequest::HttpReasonPhraseAttribute, "OK"_L1);
        return ret;
    }
}